

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::clean_example(vw *all,example *ec,bool rewind)

{
  byte in_DL;
  long in_RSI;
  long in_RDI;
  example *in_stack_00000018;
  vw *in_stack_00000020;
  
  if ((in_DL & 1) != 0) {
    *(long *)(*(long *)(in_RDI + 8) + 0x228) = *(long *)(*(long *)(in_RDI + 8) + 0x228) + -1;
  }
  empty_example(in_stack_00000020,in_stack_00000018);
  *(undefined1 *)(in_RSI + 0x68cb) = 0;
  object_pool<example,_example_initializer>::return_object
            ((object_pool<example,_example_initializer> *)all,ec);
  return;
}

Assistant:

void clean_example(vw& all, example& ec, bool rewind)
{
  if (rewind)
  {
    assert(all.p->begin_parsed_examples > 0);
    all.p->begin_parsed_examples--;
  }

  empty_example(all, ec);
  assert(ec.in_use);
  ec.in_use = false;
  all.p->example_pool.return_object(&ec);
}